

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsModuleInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type pBVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined *puVar6;
  ModuleFunctionImport var;
  bool bVar7;
  Type TVar8;
  BOOL BVar9;
  AsmJsModuleInfo *this_00;
  byte *pbVar10;
  undefined4 *puVar11;
  ModuleVar *buffer;
  PropertyIdArray *pPVar12;
  Recycler *pRVar13;
  char *pcVar14;
  byte *pbVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ModuleVar *modVar;
  ModuleVar *pMVar19;
  ulong uVar20;
  long lVar21;
  Type TVar22;
  ModuleVarImport var_00;
  uint local_d4;
  undefined1 local_d0 [4];
  RegSlot regSlot;
  Type local_c8;
  Type local_c0;
  Type TStack_bc;
  ModuleFunctionImport funcImport;
  ModuleVarImport varImport;
  uint maxAccess;
  ModuleFunction local_80;
  Type local_7c;
  ModuleFunction modFunc;
  PropertyId key;
  int local_6c;
  uint local_68;
  int exportsCount;
  ModuleFunctionTable funcTable;
  Type local_44;
  PropertyIdArray *pPStack_40;
  int id;
  Type local_34 [2];
  int count;
  
  _modFunc = function;
  this_00 = FunctionBody::AllocateAsmJsModuleInfo(function);
  pbVar10 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                      (int *)local_34);
  this_00->mArgInCount = local_34[0];
  pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                      &local_6c);
  AsmJsModuleInfo::SetExportsCount(this_00,local_6c);
  pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                      (int *)local_34);
  AsmJsModuleInfo::InitializeSlotMap(this_00,local_34[0]);
  funcTable.moduleFunctionIndex.ptr = (uint *)this_00;
  if (0 < local_6c) {
    pPVar12 = (this_00->mExports).ptr;
    pbVar10 = ReadByte(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                       (byte *)&local_68);
    pPVar12->extraSlots = (Type)local_68;
    pbVar10 = ReadBool(this,pbVar10,(bool *)&funcImport);
    pPVar12->hadDuplicates = (Type)(undefined1)funcImport.location;
    pbVar10 = ReadBool(this,pbVar10,(bool *)&funcImport);
    pPVar12->has__proto__ = (Type)(undefined1)funcImport.location;
    pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                        (int *)local_34);
    pPVar12->count = local_34[0];
    pPStack_40 = pPVar12;
    if (local_34[0] != 0) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar20 = 0;
      do {
        pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                            (int *)&local_44);
        pBVar1 = _modFunc->byteCodeCache;
        iVar16 = local_44 - pBVar1->builtInPropertyCount;
        TVar8 = local_44;
        if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
          if (pBVar1->propertyCount <= iVar16) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                        ,0x99,"(realOffset<propertyCount)",
                                        "realOffset<propertyCount");
            if (!bVar7) goto LAB_00893546;
            *puVar11 = 0;
          }
          if (pBVar1->propertyIds[iVar16] == -1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                        ,0x9a,"(propertyIds[realOffset]!=-1)",
                                        "propertyIds[realOffset]!=-1");
            if (!bVar7) goto LAB_00893546;
            *puVar11 = 0;
          }
          TVar8 = pBVar1->propertyIds[iVar16];
        }
        (&pPStack_40[1].count)[uVar20] = TVar8;
        uVar20 = uVar20 + 1;
      } while (uVar20 < pPStack_40->count);
    }
    if (0 < local_6c) {
      lVar17 = *(long *)(funcTable.moduleFunctionIndex.ptr + 0xc);
      lVar21 = 0;
      do {
        pbVar10 = ReadConstantSizedInt32
                            (pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                             &varImport.field);
        *(Type *)(lVar17 + lVar21 * 4) = varImport.field;
        lVar21 = lVar21 + 1;
      } while (lVar21 < local_6c);
    }
  }
  TVar22.ptr = funcTable.moduleFunctionIndex.ptr;
  pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                      (int *)&local_d4);
  TVar22.ptr[0xe] = local_d4;
  buffer = (ModuleVar *)
           ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                     (int *)local_34);
  AsmJsModuleInfo::SetVarCount((AsmJsModuleInfo *)TVar22.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar16 = 0;
    pMVar19 = buffer;
    do {
      buffer = pMVar19 + 1;
      AsmJsModuleInfo::SetVar((AsmJsModuleInfo *)TVar22.ptr,iVar16,*pMVar19);
      iVar16 = iVar16 + 1;
      pMVar19 = buffer;
    } while (iVar16 < (int)local_34[0]);
  }
  pPVar12 = (PropertyIdArray *)
            ReadInt32((byte *)buffer,(size_t)(this->raw + ((long)this->totalSize - (long)buffer)),
                      (int *)local_34);
  AsmJsModuleInfo::SetVarImportCount((AsmJsModuleInfo *)TVar22.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    iVar16 = 0;
    do {
      pbVar10 = ReadInt32((byte *)pPVar12,
                          (size_t)(this->raw + ((long)this->totalSize - (long)pPVar12)),
                          (int *)&funcImport);
      pbVar10 = ReadByte(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                         (byte *)&funcImport.field);
      pPVar12 = (PropertyIdArray *)
                ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar18 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar18) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar12;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) goto LAB_00893546;
          *puVar11 = 0;
          pPVar12 = pPStack_40;
        }
        if (pBVar1->propertyIds[iVar18] == -1) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar12;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00893546;
          *puVar11 = 0;
          pPVar12 = pPStack_40;
        }
        TVar8 = pBVar1->propertyIds[iVar18];
      }
      var_00._1_7_ = funcImport._1_7_;
      var_00.location._0_1_ = (undefined1)funcImport.location;
      var_00.field = TVar8;
      varImport.location = TVar8;
      AsmJsModuleInfo::SetVarImport
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar16,var_00);
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_34[0]);
  }
  pPVar12 = (PropertyIdArray *)
            ReadInt32((byte *)pPVar12,(size_t)(this->raw + ((long)this->totalSize - (long)pPVar12)),
                      (int *)local_34);
  AsmJsModuleInfo::SetFunctionImportCount
            ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    iVar16 = 0;
    do {
      pbVar10 = ReadInt32((byte *)pPVar12,
                          (size_t)(this->raw + ((long)this->totalSize - (long)pPVar12)),
                          (int *)&local_c0);
      pPVar12 = (PropertyIdArray *)
                ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar18 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar18) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar12;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) goto LAB_00893546;
          *puVar11 = 0;
          pPVar12 = pPStack_40;
        }
        if (pBVar1->propertyIds[iVar18] == -1) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar12;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00893546;
          *puVar11 = 0;
          pPVar12 = pPStack_40;
        }
        TVar8 = pBVar1->propertyIds[iVar18];
      }
      var.field = TVar8;
      var.location = local_c0;
      TStack_bc = TVar8;
      AsmJsModuleInfo::SetFunctionImport
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar16,var);
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_34[0]);
  }
  pbVar10 = ReadInt32((byte *)pPVar12,(size_t)(this->raw + ((long)this->totalSize - (long)pPVar12)),
                      (int *)local_34);
  TVar22 = funcTable.moduleFunctionIndex;
  AsmJsModuleInfo::SetFunctionCount
            ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar16 = 0;
    do {
      pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                          (int *)&local_80);
      AsmJsModuleInfo::SetFunction((AsmJsModuleInfo *)TVar22.ptr,iVar16,local_80);
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_34[0]);
  }
  pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                      (int *)local_34);
  AsmJsModuleInfo::SetFunctionTableCount((AsmJsModuleInfo *)TVar22.ptr,local_34[0]);
  funcTable.size = 0;
  funcTable._4_4_ = 0;
  if (0 < (int)local_34[0]) {
    pPStack_40 = (PropertyIdArray *)__tls_get_addr(&PTR_0155fe48);
    iVar16 = 0;
    do {
      pbVar10 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                          (int *)&local_68);
      if (local_68 == 0) {
        funcTable.size = 0;
        funcTable._4_4_ = 0;
      }
      else {
        stack0xffffffffffffff58 = &unsigned_int::typeinfo;
        pRVar13 = Memory::Recycler::TrackAllocInfo
                            (this->scriptContext->recycler,(TrackAllocData *)&varImport.field);
        uVar20 = (ulong)local_68;
        if (uVar20 == 0) {
          Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
          pcVar14 = &DAT_00000008;
        }
        else {
          BVar9 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar9 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar12 = pPStack_40;
            pPStack_40->count = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar7) goto LAB_00893546;
            pPVar12->count = 0;
          }
          pcVar14 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                              (pRVar13,uVar20 << 2);
          if (pcVar14 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar12 = pPStack_40;
            pPStack_40->count = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar7) goto LAB_00893546;
            pPVar12->count = 0;
          }
        }
        Memory::Recycler::WBSetBit((char *)&funcTable);
        funcTable._0_8_ = pcVar14;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&funcTable);
      }
      if (local_68 != 0) {
        lVar17 = 0;
        uVar20 = 0;
        do {
          pbVar10 = ReadConstantSizedInt32
                              (pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10))
                               ,(int *)(funcTable._0_8_ + lVar17));
          uVar20 = uVar20 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar20 < local_68);
      }
      uVar3 = funcTable._0_8_;
      local_d0 = (undefined1  [4])local_68;
      Memory::Recycler::WBSetBit((char *)&local_c8);
      local_c8.ptr = (uint *)uVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_c8);
      AsmJsModuleInfo::SetFunctionTable
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar16,
                 (ModuleFunctionTable *)local_d0);
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_34[0]);
  }
  TVar22.ptr = funcTable.moduleFunctionIndex.ptr;
  funcTable.moduleFunctionIndex.ptr[0x22] = *(uint *)(pbVar10 + 0x20);
  uVar3 = *(undefined8 *)pbVar10;
  uVar4 = *(undefined8 *)(pbVar10 + 8);
  uVar5 = *(undefined8 *)(pbVar10 + 0x18);
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1e) = *(undefined8 *)(pbVar10 + 0x10);
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x20) = uVar5;
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1a) = uVar3;
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1c) = uVar4;
  pbVar10 = ReadInt32(pbVar10 + 0x24,
                      (size_t)(this->raw + ((long)this->totalSize - (long)(pbVar10 + 0x24))),
                      (int *)local_34);
  if (0 < (int)local_34[0]) {
    pPStack_40 = (PropertyIdArray *)__tls_get_addr(&PTR_0155fe48);
    iVar16 = 0;
    do {
      pbVar15 = ReadInt32(pbVar10,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar10)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar18 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar18) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pPStack_40->count = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) {
LAB_00893546:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          pPStack_40->count = 0;
        }
        if (pBVar1->propertyIds[iVar18] == -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pPStack_40->count = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00893546;
          pPStack_40->count = 0;
        }
        TVar8 = pBVar1->propertyIds[iVar18];
      }
      pbVar10 = pbVar15 + 0x18;
      stack0xffffffffffffff58 = &AsmJsSlot::typeinfo;
      local_7c = TVar8;
      pRVar13 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)&varImport.field);
      register0x00000000 = (undefined **)new<Memory::Recycler>(0x18,pRVar13,0x38bbb2);
      TVar22 = funcTable.moduleFunctionIndex;
      *register0x00000000 = (undefined *)0x0;
      register0x00000000[1] = (undefined *)0x0;
      register0x00000000[2] = (undefined *)0x0;
      *(byte *)(register0x00000000 + 2) = pbVar15[0x10];
      puVar6 = *(undefined **)(pbVar15 + 8);
      *register0x00000000 = *(undefined **)pbVar15;
      register0x00000000[1] = puVar6;
      JsUtil::
      BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                (*(BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                   **)(funcTable.moduleFunctionIndex.ptr + 0x24),(int *)&local_7c,
                 (AsmJsSlot **)&varImport.field);
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)local_34[0]);
  }
  *(undefined8 *)(TVar22.ptr + 0x26) = *(undefined8 *)pbVar10;
  *(undefined8 *)(TVar22.ptr + 0x28) = *(undefined8 *)(pbVar10 + 8);
  pbVar10 = ReadInt32(pbVar10 + 0x10,
                      (size_t)(this->raw + ((long)this->totalSize - (long)(pbVar10 + 0x10))),
                      &varImport.field);
  TVar22.ptr[0x2a] = varImport.field;
  return pbVar10;
}

Assistant:

const byte * ReadAsmJsModuleInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsModuleInfo);
#endif
        AsmJsModuleInfo* moduleInfo = function->AllocateAsmJsModuleInfo();

        int count;
        current = ReadInt32(current, &count);
        moduleInfo->SetArgInCount(count);

        int exportsCount;
        current = ReadInt32(current, &exportsCount);
        moduleInfo->SetExportsCount(exportsCount);

        current = ReadInt32(current, &count);
        moduleInfo->InitializeSlotMap(count);

        int id;
        if (exportsCount > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();

            byte extraSlots;
            current = ReadByte(current, &extraSlots);
            propArray->extraSlots = extraSlots;

            bool boolVal;
            current = ReadBool(current, &boolVal);
            propArray->hadDuplicates = boolVal;

            current = ReadBool(current, &boolVal);
            propArray->has__proto__ = boolVal;

            current = ReadInt32(current, &count);
            propArray->count = count;

            for (uint i = 0; i < propArray->count; i++)
            {
                current = ReadInt32(current, &id);
                PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
                propArray->elements[i] = propertyId;
            }

            RegSlot* exportLocations = moduleInfo->GetExportsFunctionLocation();
            for (int i = 0; i < exportsCount; i++)
            {
                int32 loc;
                current = ReadConstantSizedInt32(current, &loc);
                exportLocations[i] = (uint32)loc;
            }
        }
        RegSlot regSlot;
        current = ReadUInt32(current, &regSlot);
        moduleInfo->SetExportFunctionIndex(regSlot);

        current = ReadInt32(current, &count);
        moduleInfo->SetVarCount(count);

        for (int i = 0; i < count; i++)
        {
            serialization_alignment AsmJsModuleInfo::ModuleVar * modVar;
            current = ReadStruct<AsmJsModuleInfo::ModuleVar>(current, &modVar);
            moduleInfo->SetVar(i, *modVar);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetVarImportCount(count);
        AsmJsModuleInfo::ModuleVarImport varImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &varImport.location);
            current = ReadByte(current, (byte*)&varImport.type);
            current = ReadInt32(current, &id);
            varImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetVarImport(i, varImport);
        }


        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionImportCount(count);
        AsmJsModuleInfo::ModuleFunctionImport funcImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcImport.location);
            current = ReadInt32(current, &id);
            funcImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetFunctionImport(i, funcImport);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionCount(count);

        AsmJsModuleInfo::ModuleFunction modFunc;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &modFunc.location);
            moduleInfo->SetFunction(i, modFunc);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionTableCount(count);

        AsmJsModuleInfo::ModuleFunctionTable funcTable;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcTable.size);
            if (funcTable.size > 0)
            {
                funcTable.moduleFunctionIndex = RecyclerNewArray(this->scriptContext->GetRecycler(), RegSlot, funcTable.size);
            }
            else
            {
                funcTable.moduleFunctionIndex = nullptr;
            }
            for (uint j = 0; j < funcTable.size; j++)
            {
                current = ReadConstantSizedInt32(current, (int32*)&funcTable.moduleFunctionIndex[j]);
            }
            moduleInfo->SetFunctionTable(i, funcTable);
        }

        serialization_alignment AsmJsModuleMemory * modMem = (serialization_alignment AsmJsModuleMemory*)current;
        moduleInfo->SetModuleMemory(*modMem);
        current = current + sizeof(serialization_alignment AsmJsModuleMemory);

        current = ReadInt32(current, &count);
        for (int i = 0; i < count; i++)
        {

            current = ReadInt32(current, &id);
            PropertyId key = function->GetByteCodeCache()->LookupPropertyId(id);

            serialization_alignment AsmJsSlot * slot = (serialization_alignment AsmJsSlot*)current;
            current = current + sizeof(serialization_alignment AsmJsSlot);

            // copy the slot to recycler memory
            AsmJsSlot * recyclerSlot = RecyclerNew(scriptContext->GetRecycler(), AsmJsSlot);
            *recyclerSlot = *slot;
            moduleInfo->GetAsmJsSlotMap()->Add(key, recyclerSlot);
        }

        serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE> * mathBV = (serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>);
        moduleInfo->SetAsmMathBuiltinUsed(*mathBV);

        serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE> * arrayBV = (serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>);
        moduleInfo->SetAsmArrayBuiltinUsed(*arrayBV);

        uint maxAccess;
        current = ReadUInt32(current, &maxAccess);
        moduleInfo->SetMaxHeapAccess(maxAccess);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsModuleInfo);
#endif

        return current;
    }